

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epoll.c
# Opt level: O0

cio_error cio_linux_eventloop_add(cio_eventloop *loop,cio_event_notifier *evn)

{
  int iVar1;
  int *piVar2;
  undefined1 local_2c [8];
  epoll_event epoll_ev;
  cio_event_notifier *evn_local;
  cio_eventloop *loop_local;
  
  evn->registered_events = 0;
  local_2c._0_4_ = evn->registered_events;
  unique0x10000078 = evn;
  epoll_ev.data = (epoll_data_t)evn;
  iVar1 = epoll_ctl(loop->epoll_fd,1,evn->fd,(epoll_event *)local_2c);
  if (iVar1 < 0) {
    piVar2 = __errno_location();
    loop_local._4_4_ = -*piVar2;
  }
  else {
    loop_local._4_4_ = CIO_SUCCESS;
  }
  return loop_local._4_4_;
}

Assistant:

enum cio_error cio_linux_eventloop_add(const struct cio_eventloop *loop, struct cio_event_notifier *evn)
{
	struct epoll_event epoll_ev;
	evn->registered_events = 0;

	epoll_ev.data.ptr = evn;
	epoll_ev.events = evn->registered_events;
	if (cio_unlikely(epoll_ctl(loop->epoll_fd, EPOLL_CTL_ADD, evn->fd, &epoll_ev) < 0)) {
		return (enum cio_error)(-errno);
	}

	return CIO_SUCCESS;
}